

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

qint64 __thiscall QFileDevice::readLineData(QFileDevice *this,char *data,qint64 maxlen)

{
  QIODevicePrivate *pQVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  if ((char)pQVar1[1].transactionPos == '\x01') {
    *(undefined1 *)&pQVar1[1].transactionPos = 0;
    bVar2 = flush((QFileDevice *)pQVar1->q_ptr);
    if (!bVar2) {
      return -1;
    }
  }
  cVar3 = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x138))
                    (pQVar1[1]._vptr_QIODevicePrivate,1);
  if (cVar3 == '\0') {
    lVar4 = QIODevice::readLineData(&this->super_QIODevice,data,maxlen);
  }
  else {
    lVar4 = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x120))
                      (pQVar1[1]._vptr_QIODevicePrivate,data,maxlen);
  }
  if (lVar4 < maxlen) {
    pQVar1[1].pos = 0;
  }
  return lVar4;
}

Assistant:

qint64 QFileDevice::readLineData(char *data, qint64 maxlen)
{
    Q_D(QFileDevice);
    if (!d->ensureFlushed())
        return -1;

    qint64 read;
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::FastReadLineExtension)) {
        read = d->fileEngine->readLine(data, maxlen);
    } else {
        // Fall back to QIODevice's readLine implementation if the engine
        // cannot do it faster.
        read = QIODevice::readLineData(data, maxlen);
    }

    if (read < maxlen) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}